

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FileWatcherLinux.cpp
# Opt level: O2

void __thiscall FW::FileWatcherLinux::removeWatch(FileWatcherLinux *this,WatchID watchid)

{
  _Base_ptr p_Var1;
  iterator __position;
  WatchID watchid_local;
  
  watchid_local = watchid;
  __position = std::
               _Rb_tree<unsigned_long,_std::pair<const_unsigned_long,_FW::WatchStruct_*>,_std::_Select1st<std::pair<const_unsigned_long,_FW::WatchStruct_*>_>,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_FW::WatchStruct_*>_>_>
               ::find(&(this->mWatches)._M_t,&watchid_local);
  if ((_Rb_tree_header *)__position._M_node != &(this->mWatches)._M_t._M_impl.super__Rb_tree_header)
  {
    p_Var1 = __position._M_node[1]._M_parent;
    std::
    _Rb_tree<unsigned_long,std::pair<unsigned_long_const,FW::WatchStruct*>,std::_Select1st<std::pair<unsigned_long_const,FW::WatchStruct*>>,std::less<unsigned_long>,std::allocator<std::pair<unsigned_long_const,FW::WatchStruct*>>>
    ::erase_abi_cxx11_((_Rb_tree<unsigned_long,std::pair<unsigned_long_const,FW::WatchStruct*>,std::_Select1st<std::pair<unsigned_long_const,FW::WatchStruct*>>,std::less<unsigned_long>,std::allocator<std::pair<unsigned_long_const,FW::WatchStruct*>>>
                        *)&this->mWatches,__position);
    inotify_rm_watch(this->mFD,(int)watchid_local);
    if (p_Var1 != (_Base_ptr)0x0) {
      FileSystemUtils::Path::~Path((Path *)&p_Var1->_M_parent);
    }
    operator_delete(p_Var1,0x38);
  }
  return;
}

Assistant:

void FileWatcherLinux::removeWatch(WatchID watchid)
	{
		WatchMap::iterator iter = mWatches.find(watchid);

		if(iter == mWatches.end())
			return;

		WatchStruct* watch = iter->second;
		mWatches.erase(iter);
	
		inotify_rm_watch(mFD, watchid);
		
		delete watch;
		watch = 0;
	}